

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultilineTextBox.cpp
# Opt level: O3

bool __thiscall
gui::MultilineTextBox::insertCharacter(MultilineTextBox *this,uint32_t unicode,bool suppressSignals)

{
  pair<sf::Vector2<unsigned_long>,_bool> *ppVar1;
  vector<sf::String,_std::allocator<sf::String>_> *this_00;
  long lVar2;
  unsigned_long uVar3;
  pointer pSVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  pair<sf::Vector2<unsigned_long>,_bool> *ppVar8;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar9;
  size_t sVar10;
  String *pSVar11;
  pointer pSVar12;
  size_t sVar13;
  ulong uVar14;
  undefined7 in_register_00000011;
  Vector2<unsigned_long> *pVVar15;
  ulong uVar16;
  unsigned_long uVar17;
  _Alloc_hider _Var18;
  const_iterator __begin1_1;
  const_iterator __end1;
  long lVar19;
  const_iterator __begin1;
  ulong uVar20;
  const_iterator __begin1_2;
  pair<sf::Vector2<unsigned_long>,_sf::Vector2<unsigned_long>_> selection;
  wregex regex;
  vector<sf::String,_std::allocator<sf::String>_> lastBoxStrings;
  Vector2<unsigned_long> lastCaretPosition;
  Vector2<unsigned_long> lastScroll;
  wstring local_138;
  size_t local_118;
  _Alloc_hider local_110;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_100;
  ulong local_f0;
  uint32_t local_e8;
  undefined4 local_e4;
  size_t local_e0;
  size_t local_d8;
  size_t local_d0;
  wstring local_c8;
  String local_a8;
  vector<sf::String,_std::allocator<sf::String>_> local_88;
  String *local_68;
  long local_60;
  Vector2<unsigned_long> local_58;
  unsigned_long local_48;
  unsigned_long uStack_40;
  
  if (this->readOnly_ != false) {
    return false;
  }
  local_88.super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = 0;
  uStack_40 = 0;
  local_58.x = 0;
  local_58.y = 0;
  std::locale::locale((locale *)&local_110);
  sf::String::String((String *)&local_138,".*",(locale *)&local_110);
  pSVar11 = &this->regexPattern_;
  bVar6 = sf::operator!=(pSVar11,(String *)&local_138);
  if ((Vector2<unsigned_long> *)local_138._M_dataplus._M_p !=
      (Vector2<unsigned_long> *)&local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  std::locale::~locale((locale *)&local_110);
  if (bVar6) {
    std::vector<sf::String,_std::allocator<sf::String>_>::operator=(&local_88,&this->boxStrings_);
    local_48 = (this->scroll_).x;
    uStack_40 = (this->scroll_).y;
    local_58.x = (this->caretPosition_).x;
    local_58.y = (this->caretPosition_).y;
  }
  local_e4 = (undefined4)CONCAT71(in_register_00000011,suppressSignals);
  local_68 = pSVar11;
  if ((this->selectionStart_).second == true) {
    ppVar1 = &this->selectionStart_;
    pVVar15 = &this->selectionEnd_;
    uVar20 = (this->selectionStart_).first.y;
    uVar14 = (this->selectionEnd_).y;
    if ((uVar20 < uVar14) ||
       ((ppVar8 = ppVar1, uVar20 == uVar14 && ((ppVar1->first).x < pVVar15->x)))) {
      ppVar8 = (pair<sf::Vector2<unsigned_long>,_bool> *)pVVar15;
      pVVar15 = &ppVar1->first;
    }
    uVar5 = pVVar15->y;
    local_138._0_16_ = *pVVar15;
    local_138.field_2._M_allocated_capacity = (ppVar8->first).x;
    uVar16 = (ppVar8->first).y;
    local_60 = uVar5 - uVar16;
    local_138.field_2._8_8_ = uVar16;
    local_e8 = unicode;
    if (uVar5 < uVar16 || local_60 == 0) {
      this_00 = &this->boxStrings_;
      local_e0 = 0xffffffffffffffff;
      lVar19 = 0;
      local_118 = uVar5 << 5;
      local_f0 = uVar16;
      local_d8 = local_138.field_2._M_allocated_capacity;
      local_d0 = ((Vector2<unsigned_long> *)&pVVar15->x)->x;
      do {
        sVar10 = local_118;
        if (lVar19 == 0) {
          if (uVar5 == uVar16) {
            sf::String::substring
                      ((String *)&local_c8,
                       (String *)
                       ((long)&(((this_00->
                                 super__Vector_base<sf::String,_std::allocator<sf::String>_>).
                                 _M_impl.super__Vector_impl_data._M_start)->m_string)._M_dataplus.
                               _M_p + local_118),0,local_d0);
            sf::String::substring
                      (&local_a8,
                       (String *)
                       ((long)&(((this_00->
                                 super__Vector_base<sf::String,_std::allocator<sf::String>_>).
                                 _M_impl.super__Vector_impl_data._M_start)->m_string)._M_dataplus.
                               _M_p + sVar10),local_d8,local_e0);
            sf::operator+((String *)&local_110,(String *)&local_c8,&local_a8);
            sf::String::operator=
                      ((String *)
                       ((long)&(((this_00->
                                 super__Vector_base<sf::String,_std::allocator<sf::String>_>).
                                 _M_impl.super__Vector_impl_data._M_start)->m_string)._M_dataplus.
                               _M_p + local_118),(String *)&local_110);
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_110._M_p != &local_100) {
              operator_delete(local_110._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
                 *)local_a8.m_string._M_dataplus._M_p != &local_a8.m_string.field_2) {
              operator_delete(local_a8.m_string._M_dataplus._M_p);
            }
            paVar9 = &local_c8.field_2;
            _Var18._M_p = local_c8._M_dataplus._M_p;
          }
          else {
            sf::String::substring
                      ((String *)&local_110,
                       (String *)
                       ((long)&(((this_00->
                                 super__Vector_base<sf::String,_std::allocator<sf::String>_>).
                                 _M_impl.super__Vector_impl_data._M_start)->m_string)._M_dataplus.
                               _M_p + local_118),0,local_d0);
            sf::String::operator=
                      ((String *)
                       ((long)&(((this_00->
                                 super__Vector_base<sf::String,_std::allocator<sf::String>_>).
                                 _M_impl.super__Vector_impl_data._M_start)->m_string)._M_dataplus.
                               _M_p + sVar10),(String *)&local_110);
            paVar9 = &local_100;
            _Var18._M_p = (pointer)local_110._M_p;
          }
          uVar16 = local_f0;
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)_Var18._M_p != paVar9) {
            operator_delete(_Var18._M_p);
            uVar16 = local_f0;
          }
        }
        else if (uVar5 + lVar19 < uVar16 && uVar5 < uVar5 + lVar19) {
          std::vector<sf::String,_std::allocator<sf::String>_>::_M_erase
                    (this_00,(String *)
                             ((long)&(this_00->
                                     super__Vector_base<sf::String,_std::allocator<sf::String>_>).
                                     _M_impl.super__Vector_impl_data._M_start[1].m_string.
                                     _M_dataplus._M_p + local_118));
          uVar16 = local_f0;
        }
        else if (local_60 + lVar19 == 0) {
          sf::String::substring
                    ((String *)&local_110,
                     (String *)
                     ((long)&(this_00->super__Vector_base<sf::String,_std::allocator<sf::String>_>).
                             _M_impl.super__Vector_impl_data._M_start[1].m_string._M_dataplus._M_p +
                     local_118),local_d8,local_e0);
          sf::String::operator+=
                    ((String *)
                     ((long)&(((this_00->super__Vector_base<sf::String,_std::allocator<sf::String>_>
                               )._M_impl.super__Vector_impl_data._M_start)->m_string)._M_dataplus.
                             _M_p + sVar10),(String *)&local_110);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_110._M_p != &local_100) {
            operator_delete(local_110._M_p);
          }
          std::vector<sf::String,_std::allocator<sf::String>_>::_M_erase
                    (this_00,(String *)
                             ((long)&(this_00->
                                     super__Vector_base<sf::String,_std::allocator<sf::String>_>).
                                     _M_impl.super__Vector_impl_data._M_start[1].m_string.
                                     _M_dataplus._M_p + local_118));
          uVar16 = local_f0;
        }
        lVar2 = lVar19 + 1;
        lVar19 = lVar19 + 1;
      } while (lVar2 + uVar5 <= uVar16);
      uVar20 = (this->selectionStart_).first.y;
      uVar14 = (this->selectionEnd_).y;
    }
    uVar17 = (this->selectionStart_).first.x;
    uVar3 = (this->selectionEnd_).x;
    updateCaretPosition(this,(Vector2<unsigned_long> *)&local_138,false);
    bVar6 = uVar20 != uVar14 || uVar17 != uVar3;
    unicode = local_e8;
  }
  else {
    bVar6 = false;
  }
  pVVar15 = &this->caretPosition_;
  sVar10 = findCaretOffset(this,pVVar15);
  if ((int)unicode < 10) {
    if (unicode == 8) {
      if ((sVar10 == 0) || (bVar6 != false)) goto LAB_0019375a;
      uVar17 = (this->caretPosition_).x;
      pSVar11 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                _M_impl.super__Vector_impl_data._M_start + (this->caretPosition_).y;
      if (uVar17 == 0) {
        sf::String::operator+=(pSVar11 + -1,pSVar11);
        std::vector<sf::String,_std::allocator<sf::String>_>::_M_erase
                  (&this->boxStrings_,
                   (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                   _M_impl.super__Vector_impl_data._M_start + (this->caretPosition_).y);
      }
      else {
        sf::String::erase(pSVar11,uVar17 - 1,1);
      }
      uVar17 = (this->scroll_).x;
      if (uVar17 != 0) {
        uVar3 = (this->sizeCharacters_).x;
        pSVar4 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        uVar20 = 0;
        for (pSVar12 = (this->boxStrings_).
                       super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl.
                       super__Vector_impl_data._M_start; pSVar12 != pSVar4; pSVar12 = pSVar12 + 1) {
          sVar13 = sf::String::getSize(pSVar12);
          if (uVar20 <= sVar13) {
            uVar20 = sVar13;
          }
        }
        if (uVar20 < uVar3 + uVar17) {
          (this->scroll_).x = (this->scroll_).x - 1;
        }
      }
      local_138._0_16_ = findCaretPosition(this,sVar10 - 1);
      updateCaretPosition(this,(Vector2<unsigned_long> *)&local_138,false);
    }
    else {
      if (unicode == 9) {
        uVar20 = pVVar15->x | 0xfffffffffffffffc;
        do {
          bVar7 = insertCharacter(this,0x20,true);
          if (bVar7) {
            bVar6 = true;
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 != 0);
        goto LAB_0019375a;
      }
LAB_001933b2:
      uVar20 = this->maxCharacters_;
      if (uVar20 != 0) {
        pSVar12 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pSVar4 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        lVar19 = 0;
        local_118 = sVar10;
        if (pSVar12 != pSVar4) {
          do {
            sVar10 = sf::String::getSize(pSVar12);
            lVar19 = lVar19 + sVar10 + 1;
            pSVar12 = pSVar12 + 1;
          } while (pSVar12 != pSVar4);
          uVar20 = this->maxCharacters_;
        }
        uVar14 = 0;
        if (lVar19 != 0) {
          uVar14 = lVar19 - 1;
        }
        sVar10 = local_118;
        if (uVar20 <= uVar14) goto LAB_0019375a;
      }
      uVar17 = (this->caretPosition_).y;
      pSVar12 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                _M_impl.super__Vector_impl_data._M_start;
      sVar13 = (this->caretPosition_).x;
      sf::String::String((String *)&local_138,unicode);
      sf::String::insert(pSVar12 + uVar17,sVar13,(String *)&local_138);
      if ((Vector2<unsigned_long> *)local_138._M_dataplus._M_p !=
          (Vector2<unsigned_long> *)&local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      local_138._0_16_ = findCaretPosition(this,sVar10 + 1);
      updateCaretPosition(this,(Vector2<unsigned_long> *)&local_138,false);
    }
  }
  else {
    if (unicode == 0x7f) {
      if (bVar6 == false) {
        pSVar4 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        lVar19 = 0;
        local_118 = sVar10;
        for (pSVar12 = (this->boxStrings_).
                       super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl.
                       super__Vector_impl_data._M_start; pSVar12 != pSVar4; pSVar12 = pSVar12 + 1) {
          sVar10 = sf::String::getSize(pSVar12);
          lVar19 = lVar19 + sVar10 + 1;
        }
        uVar20 = 0;
        if (lVar19 != 0) {
          uVar20 = lVar19 - 1;
        }
        if (local_118 < uVar20) {
          sVar10 = (this->caretPosition_).x;
          sVar13 = sf::String::getSize((this->boxStrings_).
                                       super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                                       _M_impl.super__Vector_impl_data._M_start +
                                       (this->caretPosition_).y);
          pSVar11 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                    _M_impl.super__Vector_impl_data._M_start + (this->caretPosition_).y;
          if (sVar10 == sVar13) {
            sf::String::operator+=(pSVar11,pSVar11 + 1);
            std::vector<sf::String,_std::allocator<sf::String>_>::_M_erase
                      (&this->boxStrings_,
                       (this->boxStrings_).
                       super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl.
                       super__Vector_impl_data._M_start + (this->caretPosition_).y + 1);
          }
          else {
            sf::String::erase(pSVar11,pVVar15->x,1);
          }
          uVar17 = (this->scroll_).x;
          if (uVar17 != 0) {
            uVar3 = (this->sizeCharacters_).x;
            pSVar4 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            uVar20 = 0;
            for (pSVar12 = (this->boxStrings_).
                           super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl.
                           super__Vector_impl_data._M_start; pSVar12 != pSVar4;
                pSVar12 = pSVar12 + 1) {
              sVar10 = sf::String::getSize(pSVar12);
              if (uVar20 <= sVar10) {
                uVar20 = sVar10;
              }
            }
            if (uVar20 < uVar3 + uVar17) {
              (this->scroll_).x = (this->scroll_).x - 1;
            }
          }
          bVar6 = true;
          updateCaretPosition(this,pVVar15,false);
        }
      }
      goto LAB_0019375a;
    }
    if (unicode != 10) goto LAB_001933b2;
    uVar20 = this->maxCharacters_;
    if (uVar20 != 0) {
      pSVar12 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pSVar4 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      lVar19 = 0;
      if (pSVar12 != pSVar4) {
        do {
          sVar13 = sf::String::getSize(pSVar12);
          lVar19 = lVar19 + sVar13 + 1;
          pSVar12 = pSVar12 + 1;
        } while (pSVar12 != pSVar4);
        uVar20 = this->maxCharacters_;
      }
      uVar14 = 0;
      if (lVar19 != 0) {
        uVar14 = lVar19 - 1;
      }
      if (uVar20 <= uVar14) goto LAB_0019375a;
    }
    if (this->maxLines_ == 0) {
      pSVar12 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                _M_impl.super__Vector_impl_data._M_start;
    }
    else {
      pSVar12 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (this->maxLines_ <=
          (ulong)((long)(this->boxStrings_).
                        super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pSVar12 >> 5)) goto LAB_0019375a;
    }
    uVar17 = (this->caretPosition_).y;
    sf::String::substring
              ((String *)&local_138,pSVar12 + uVar17,(this->caretPosition_).x,0xffffffffffffffff);
    std::vector<sf::String,_std::allocator<sf::String>_>::_M_insert_rval
              (&this->boxStrings_,pSVar12 + uVar17 + 1,(value_type *)&local_138);
    if ((Vector2<unsigned_long> *)local_138._M_dataplus._M_p !=
        (Vector2<unsigned_long> *)&local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    sf::String::substring
              ((String *)&local_138,
               (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
               _M_impl.super__Vector_impl_data._M_start + (this->caretPosition_).y,0,
               (this->caretPosition_).x);
    sf::String::operator=
              ((this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
               _M_impl.super__Vector_impl_data._M_start + (this->caretPosition_).y,
               (String *)&local_138);
    if ((Vector2<unsigned_long> *)local_138._M_dataplus._M_p !=
        (Vector2<unsigned_long> *)&local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    local_138._0_16_ = findCaretPosition(this,sVar10 + 1);
    updateCaretPosition(this,(Vector2<unsigned_long> *)&local_138,false);
  }
  bVar6 = true;
LAB_0019375a:
  std::locale::locale((locale *)&local_110);
  sf::String::String((String *)&local_138,".*",(locale *)&local_110);
  pSVar11 = local_68;
  bVar7 = sf::operator!=(local_68,(String *)&local_138);
  if ((Vector2<unsigned_long> *)local_138._M_dataplus._M_p !=
      (Vector2<unsigned_long> *)&local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  std::locale::~locale((locale *)&local_110);
  if (bVar7) {
    sf::String::toWideString_abi_cxx11_(&local_138,pSVar11);
    std::__cxx11::basic_regex<wchar_t,std::__cxx11::regex_traits<wchar_t>>::
    basic_regex<std::char_traits<wchar_t>,std::allocator<wchar_t>>
              ((basic_regex<wchar_t,std::__cxx11::regex_traits<wchar_t>> *)&local_110,&local_138,
               0x10);
    if ((Vector2<unsigned_long> *)local_138._M_dataplus._M_p !=
        (Vector2<unsigned_long> *)&local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    anon_unknown.dwarf_44ee9e::combineStrings(&local_a8,&this->boxStrings_);
    sf::String::toWideString_abi_cxx11_(&local_c8,&local_a8);
    local_138.field_2._M_allocated_capacity = 0;
    local_138.field_2._8_8_ = 0;
    local_138._0_16_ = ZEXT816(0);
    bVar7 = std::__detail::
            __regex_algo_impl<__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>>>,wchar_t,std::__cxx11::regex_traits<wchar_t>,(std::__detail::_RegexExecutorPolicy)0,true>
                      ((__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                        )local_c8._M_dataplus._M_p,
                       (__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                        )(local_c8._M_dataplus._M_p + local_c8._M_string_length),
                       (match_results<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
                        *)&local_138,
                       (basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> *)&local_110,0);
    if (local_138._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
         *)local_a8.m_string._M_dataplus._M_p != &local_a8.m_string.field_2) {
      operator_delete(local_a8.m_string._M_dataplus._M_p);
    }
    if (!bVar7) {
      std::vector<sf::String,_std::allocator<sf::String>_>::operator=(&this->boxStrings_,&local_88);
      (this->scroll_).x = local_48;
      (this->scroll_).y = uStack_40;
      bVar6 = false;
      updateCaretPosition(this,&local_58,false);
    }
    std::__cxx11::basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_>::~basic_regex
              ((basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> *)&local_110);
  }
  if (((~bVar6 | (byte)local_e4) & 1) == 0) {
    pSVar4 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl
             .super__Vector_impl_data._M_finish;
    lVar19 = 0;
    for (pSVar12 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                   _M_impl.super__Vector_impl_data._M_start; pSVar12 != pSVar4;
        pSVar12 = pSVar12 + 1) {
      sVar10 = sf::String::getSize(pSVar12);
      lVar19 = lVar19 + sVar10 + 1;
    }
    uVar17 = 0;
    if (lVar19 != 0) {
      uVar17 = lVar19 - 1;
    }
    Signal<gui::Widget_*,_unsigned_long>::emit(&this->onTextChange,&this->super_Widget,uVar17);
  }
  std::vector<sf::String,_std::allocator<sf::String>_>::~vector(&local_88);
  return bVar6;
}

Assistant:

bool MultilineTextBox::insertCharacter(uint32_t unicode, bool suppressSignals) {
    if (readOnly_) {
        return false;
    }
    // For a regex pattern, first backup the state that we need to restore if the pattern match fails.
    std::vector<sf::String> lastBoxStrings;
    sf::Vector2<size_t> lastScroll, lastCaretPosition;
    if (regexPattern_ != ".*") {
        lastBoxStrings = boxStrings_;
        lastScroll = scroll_;
        lastCaretPosition = caretPosition_;
    }

    // Check if the selection will be replaced.
    bool textChanged = false, clearedSelection = false;
    if (selectionStart_.second) {
        auto selection = sortByYFirst(selectionStart_.first, selectionEnd_);
        for (size_t y = selection.first.y; y <= selection.second.y; ++y) {
            if (y == selection.first.y) {
                if (y == selection.second.y) {
                    boxStrings_[y] = boxStrings_[y].substring(0, selection.first.x) + boxStrings_[y].substring(selection.second.x);
                } else {
                    boxStrings_[y] = boxStrings_[y].substring(0, selection.first.x);
                }
            } else if (y > selection.first.y && y < selection.second.y) {
                boxStrings_.erase(boxStrings_.begin() + selection.first.y + 1);
            } else if (y == selection.second.y) {
                boxStrings_[selection.first.y] += boxStrings_[selection.first.y + 1].substring(selection.second.x);
                boxStrings_.erase(boxStrings_.begin() + selection.first.y + 1);
            }
        }
        if (selectionStart_.first != selectionEnd_) {
            textChanged = true;
            clearedSelection = true;
        }
        updateCaretPosition(selection.first, false);
    }
    size_t caretOffset = findCaretOffset(caretPosition_);

    if (unicode == '\u000a') {    // Enter key.
        if ((maxCharacters_ == 0 || findStringsLength(boxStrings_) < maxCharacters_) && (maxLines_ == 0 || boxStrings_.size() < maxLines_)) {
            boxStrings_.emplace(boxStrings_.begin() + caretPosition_.y + 1, boxStrings_[caretPosition_.y].substring(caretPosition_.x));
            boxStrings_[caretPosition_.y] = boxStrings_[caretPosition_.y].substring(0, caretPosition_.x);
            updateCaretPosition(caretOffset + 1, false);
            textChanged = true;
        }
    } else if (unicode == '\u0008') {    // Backspace key.
        if (!clearedSelection && caretOffset > 0) {
            if (caretPosition_.x == 0) {
                boxStrings_[caretPosition_.y - 1] += boxStrings_[caretPosition_.y];
                boxStrings_.erase(boxStrings_.begin() + caretPosition_.y);
            } else {
                boxStrings_[caretPosition_.y].erase(caretPosition_.x - 1, 1);
            }
            if (scroll_.x > 0 && scroll_.x + sizeCharacters_.x > findLongestLength(boxStrings_)) {
                --scroll_.x;
            }
            updateCaretPosition(caretOffset - 1, false);
            textChanged = true;
        }
    } else if (unicode == '\u0009') {    // Tab key.
        size_t count = 4 - caretPosition_.x % 4;
        for (size_t i = 0; i < count; ++i) {
            textChanged = insertCharacter(' ', true) || textChanged;
        }
    } else if (unicode == '\u007f') {    // Delete key.
        if (!clearedSelection && caretOffset < findStringsLength(boxStrings_)) {
            if (caretPosition_.x == boxStrings_[caretPosition_.y].getSize()) {
                boxStrings_[caretPosition_.y] += boxStrings_[caretPosition_.y + 1];
                boxStrings_.erase(boxStrings_.begin() + caretPosition_.y + 1);
            } else {
                boxStrings_[caretPosition_.y].erase(caretPosition_.x, 1);
            }
            if (scroll_.x > 0 && scroll_.x + sizeCharacters_.x > findLongestLength(boxStrings_)) {
                --scroll_.x;
            }
            updateCaretPosition(caretPosition_, false);
            textChanged = true;
        }
    } else {    // Printable character.
        if (maxCharacters_ == 0 || findStringsLength(boxStrings_) < maxCharacters_) {
            boxStrings_[caretPosition_.y].insert(caretPosition_.x, sf::String(unicode));
            updateCaretPosition(caretOffset + 1, false);
            textChanged = true;
        }
    }

    if (regexPattern_ != ".*") {
        std::wregex regex(regexPattern_.toWideString());
        if (!std::regex_match(combineStrings(boxStrings_).toWideString(), regex)) {
            GUI_DEBUG << "Regex pattern match failed, discarding character input.\n";
            boxStrings_ = lastBoxStrings;
            scroll_ = lastScroll;
            updateCaretPosition(lastCaretPosition, false);
            textChanged = false;
        }
    }

    if (textChanged && !suppressSignals) {
        onTextChange.emit(this, findStringsLength(boxStrings_));
    }
    return textChanged;
}